

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true>::ControlPacket
          (ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true> *this)

{
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125330;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             (FixedFieldGeneric *)&this->fixedVariableHeader,
             &(this->props).super_SerializableProperties,&this->payload);
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125330;
  (this->header).super_FixedHeaderBase.typeAndFlags = 'p';
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_00125388;
  *(undefined2 *)
   &(this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
    field_0x14 = 0;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  field_0x16 = 0;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  super_FixedFieldGeneric.value =
       &(this->fixedVariableHeader).super_FixedFieldWithIDAndReason._v.super_GenericTypeBase;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  remLength = 3;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason._v.super_GenericTypeBase.
  _vptr_GenericTypeBase = (_func_int **)&PTR_typeSize_001250f0;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason._v.value =
       (IDAndReason *)
       &(this->fixedVariableHeader).super_FixedFieldWithIDAndReason.
        super_FixedFieldWithRemainingLength.field_0x14;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  super_FixedFieldGeneric.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_001253d0;
  PropertiesView::PropertiesView(&this->props);
  (this->payload).super_EmptySerializable.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00124b60;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }